

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O0

reentrant_put_transaction<Msg> * __thiscall
density::
sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
::
try_start_reentrant_emplace<density_tests::SpQueueSamples<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
          (reentrant_put_transaction<Msg> *__return_storage_ptr__,
          sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
          *this,progress_guarantee i_progress_guarantee)

{
  runtime_type<> *prVar1;
  runtime_type<> rVar2;
  reentrant_put_transaction<Msg> local_90;
  runtime_type<> *local_70;
  runtime_type<> *type_storage;
  runtime_type *type;
  undefined1 local_58 [7];
  bool is_noexcept;
  undefined1 local_38 [8];
  Allocation push_data;
  progress_guarantee i_progress_guarantee_local;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  *this_local;
  
  push_data.m_user_storage._4_4_ = i_progress_guarantee;
  detail::
  LFQueue_Base<density::runtime_type<>,density::basic_default_allocator<65536ul>,density::detail::SpQueue_TailMultiple<density::runtime_type<>,density::basic_default_allocator<65536ul>,density::default_busy_wait>>
  ::try_inplace_allocate<1ul,true,24ul,8ul>((Allocation *)local_38,this,i_progress_guarantee);
  if (push_data.m_next_ptr == 0) {
    memset(local_58,0,0x20);
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::reentrant_put_transaction<Msg>::reentrant_put_transaction
              ((reentrant_put_transaction<Msg> *)local_58);
    reentrant_put_transaction<density_tests::SpQueueSamples<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
    ::
    reentrant_put_transaction<density_tests::SpQueueSamples<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples()::Msg,void>
              ((reentrant_put_transaction<density_tests::SpQueueSamples<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
                *)__return_storage_ptr__,(reentrant_put_transaction<Msg> *)local_58);
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::reentrant_put_transaction<Msg>::~reentrant_put_transaction
              ((reentrant_put_transaction<Msg> *)local_58);
  }
  else {
    type._7_1_ = 1;
    type_storage = (runtime_type<> *)0x0;
    prVar1 = detail::
             LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
             ::type_after_control((ControlBlock *)local_38);
    local_70 = prVar1;
    rVar2 = runtime_type<>::
            make<density_tests::SpQueueSamples<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
                      ();
    prVar1->m_feature_table = rVar2.m_feature_table;
    type_storage = prVar1;
    memset((void *)push_data.m_next_ptr,0,0x18);
    density_tests::
    SpQueueSamples<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0>::
    spinlocking_heterogeneous_queue_reentrant_put_transaction_samples::Msg::Msg
              ((Msg *)push_data.m_next_ptr);
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::reentrant_put_transaction<Msg>::reentrant_put_transaction
              (&local_90,0,
               (sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                *)this,(Allocation *)local_38);
    reentrant_put_transaction<density_tests::SpQueueSamples<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
    ::
    reentrant_put_transaction<density_tests::SpQueueSamples<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples()::Msg,void>
              ((reentrant_put_transaction<density_tests::SpQueueSamples<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>::spinlocking_heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
                *)__return_storage_ptr__,&local_90);
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::reentrant_put_transaction<Msg>::~reentrant_put_transaction(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<ELEMENT_TYPE>
          try_start_reentrant_emplace(progress_guarantee i_progress_guarantee, CONSTRUCTION_PARAMS &&... i_construction_params) noexcept(
            noexcept(ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...)) &&
            noexcept(runtime_type(runtime_type::template make<ELEMENT_TYPE>())))
        {
            auto push_data = Base::template try_inplace_allocate<
              detail::LfQueue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>(i_progress_guarantee);
            if (push_data.m_user_storage == nullptr)
            {
                return reentrant_put_transaction<ELEMENT_TYPE>();
            }

            constexpr bool is_noexcept =
              std::is_nothrow_constructible<ELEMENT_TYPE, CONSTRUCTION_PARAMS...>::value &&
              noexcept(runtime_type(runtime_type::template make<ELEMENT_TYPE>()));

            runtime_type * type = nullptr;

            if (is_noexcept)
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            else
            {
                try
                {
                    auto const type_storage = Base::type_after_control(push_data.m_control_block);
                    DENSITY_ASSUME(type_storage != nullptr);
                    type =
                      new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                    DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                    new (push_data.m_user_storage)
                      ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
                }
                catch (...)
                {
                    if (type != nullptr)
                        type->RUNTIME_TYPE::~RUNTIME_TYPE();

                    Base::cancel_put_nodestroy_impl(push_data);
                    DENSITY_INTERNAL_RETHROW_FROM_NOEXCEPT
                }
            }

            return reentrant_put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }